

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O2

void loadTriangleProgram(void)

{
  bool bVar1;
  djg_program *program;
  runtime_error *this;
  char *str;
  char buf [1024];
  
  program = djgp_create();
  str = "#define MODE_QUAD\n";
  if (g_params.mode == 0) {
    str = "#define MODE_TRIANGLE\n";
  }
  djgp_push_string(program,str);
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  strcat2(buf,g_app.dir.shader,"Triangle.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 1);
  djgp_release(program);
  if (bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"shader creation error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void loadTriangleProgram()
{
    djg_program *djp = djgp_create();
    GLuint *glp = &g_gl.programs[PROGRAM_TRIANGLE];
    char buf[1024];

    if (g_params.mode == MODE_TRIANGLE)
        djgp_push_string(djp, "#define MODE_TRIANGLE\n");
    else
        djgp_push_string(djp, "#define MODE_QUAD\n");

    djgp_push_file(djp, PATH_TO_LEB_GLSL_LIBRARY "LongestEdgeBisection.glsl");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "Triangle.glsl"));
    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        throw std::runtime_error("shader creation error");
    }
    djgp_release(djp);
}